

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_line.c
# Opt level: O1

void report_bogus_stmt_list_form(Dwarf_Debug dbg,Dwarf_Half attrform,Dwarf_Error *error)

{
  char *pcVar1;
  undefined6 in_register_00000032;
  char *formname;
  dwarfstring f;
  char buf [32];
  dwarfstring m;
  char *local_90;
  dwarfstring_s local_88;
  char local_68 [32];
  dwarfstring_s local_48;
  
  local_90 = (char *)0x0;
  local_68[0] = '\0';
  dwarfstring_constructor_static(&local_88,local_68,0x20);
  dwarf_get_FORM_name((uint)CONCAT62(in_register_00000032,attrform),&local_90);
  if (local_90 == (char *)0x0) {
    dwarfstring_append_printf_u(&local_88,"Invalid Form Code  0xllx",(ulong)attrform);
  }
  else {
    dwarfstring_append(&local_88,local_90);
  }
  dwarfstring_constructor_fixed(&local_48,200);
  pcVar1 = dwarfstring_string(&local_88);
  dwarfstring_append_printf_s
            (&local_48,
             "DW_DLE_LINE_OFFSET_WRONG_FORM: form %s instead of an allowed section offset form.",
             pcVar1);
  pcVar1 = dwarfstring_string(&local_48);
  _dwarf_error_string(dbg,error,0x150,pcVar1);
  dwarfstring_destructor(&local_48);
  dwarfstring_destructor(&local_88);
  return;
}

Assistant:

static void
report_bogus_stmt_list_form(Dwarf_Debug dbg,
    Dwarf_Half attrform, Dwarf_Error *error)
{
    dwarfstring m; /* OK constructor_fixed  */
    dwarfstring f; /* Ok constructor_static */
    char buf[32];
    const char *formname = 0;

    buf[0] = 0;
    dwarfstring_constructor_static(&f,buf,sizeof(buf));
    dwarf_get_FORM_name(attrform,&formname);
    if (!formname) {
        dwarfstring_append_printf_u(&f,"Invalid Form Code "
            " 0x" DW_PR_DUx,attrform);
    } else {
        dwarfstring_append(&f,(char *)formname);
    }
    dwarfstring_constructor_fixed(&m,200);
    dwarfstring_append_printf_s(&m,
        "DW_DLE_LINE_OFFSET_WRONG_FORM: form %s "
        "instead of an allowed section offset form.",
        dwarfstring_string(&f));
    _dwarf_error_string(dbg, error, DW_DLE_LINE_OFFSET_WRONG_FORM,
        dwarfstring_string(&m));
    dwarfstring_destructor(&m);
    dwarfstring_destructor(&f);
}